

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O0

void EdgeDetectionHelper::find
               (EdgeDetectionBase<double> *edgeDetection,Image *image,uint32_t x,uint32_t y,
               uint32_t width,uint32_t height,EdgeParameter *edgeParameter)

{
  EdgeParameter *in_stack_000001f8;
  uint32_t in_stack_00000200;
  uint32_t in_stack_00000204;
  uint32_t in_stack_00000208;
  uint32_t in_stack_0000020c;
  Image *in_stack_00000210;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *in_stack_00000220;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *in_stack_00000228;
  
  anon_unknown.dwarf_57ca7::findEdgePoints<double>
            (in_stack_00000210,in_stack_0000020c,in_stack_00000208,in_stack_00000204,
             in_stack_00000200,in_stack_000001f8,in_stack_00000220,in_stack_00000228);
  return;
}

Assistant:

void EdgeDetectionHelper::find( EdgeDetectionBase<double> & edgeDetection, const PenguinV_Image::Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height,
                                const EdgeParameter & edgeParameter )
{
    findEdgePoints( image, x, y, width, height, edgeParameter, edgeDetection.positiveEdgePoint, edgeDetection.negativeEdgePoint );
}